

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_float.c
# Opt level: O3

vf_profile_t *
vf_profile_custom(vf_profile_t *__return_storage_ptr__,uint16_t bits,uint16_t exp,vf_base_t bias)

{
  undefined6 in_register_00000032;
  int iVar1;
  ulong uVar2;
  vf_base_t vVar3;
  
  if (bits < 8) {
    __assert_fail("bits >= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                  ,0x1a,
                  "vf_profile_t vf_profile_custom(const uint16_t, const uint16_t, const vf_base_t)")
    ;
  }
  if (exp == 0) {
    __assert_fail("exp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                  ,0x1b,
                  "vf_profile_t vf_profile_custom(const uint16_t, const uint16_t, const vf_base_t)")
    ;
  }
  iVar1 = (int)CONCAT62(in_register_00000032,bits);
  if (iVar1 + -2 <= (int)(uint)exp) {
    __assert_fail("exp < (bits - 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                  ,0x1c,
                  "vf_profile_t vf_profile_custom(const uint16_t, const uint16_t, const vf_base_t)")
    ;
  }
  if (bias != 0) {
    if (bias < (ulong)~(-1L << ((byte)exp & 0x3f))) {
      iVar1 = iVar1 + -1;
      vVar3 = 1L << ((byte)iVar1 & 0x3f);
      __return_storage_ptr__->sgn_mask = vVar3;
      iVar1 = iVar1 - (uint)exp;
      uVar2 = -1L << ((byte)iVar1 & 0x3f);
      __return_storage_ptr__->exp_mask = vVar3 - 1 & uVar2;
      __return_storage_ptr__->mnt_mask = ~uVar2;
      __return_storage_ptr__->bias = bias;
      __return_storage_ptr__->mask = 0xffffffffffffffff >> (-(char)bits & 0x3fU);
      __return_storage_ptr__->bits = bits;
      __return_storage_ptr__->sgn_bits = 1;
      __return_storage_ptr__->exp_bits = exp;
      __return_storage_ptr__->mnt_bits = (uint16_t)iVar1;
      return __return_storage_ptr__;
    }
    __assert_fail("bias < ((vf_base_t)1 << exp) - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                  ,0x1e,
                  "vf_profile_t vf_profile_custom(const uint16_t, const uint16_t, const vf_base_t)")
    ;
  }
  __assert_fail("bias > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/regexident[P]var_float/src/var_float.c"
                ,0x1d,
                "vf_profile_t vf_profile_custom(const uint16_t, const uint16_t, const vf_base_t)");
}

Assistant:

vf_profile_t vf_profile_custom(const uint16_t bits, const uint16_t exp, const vf_base_t bias) {
	assert(bits >= 8);
	assert(exp > 0);
	assert(exp < (bits - 2));
	assert(bias > 0);
	assert(bias < ((vf_base_t)1 << exp) - 1);
	return (vf_profile_t){
		.bias = bias,
		.bits = bits,
		.mask = (~(vf_base_t)0) >> ((sizeof(vf_base_t) * CHAR_BIT) - bits),
		.sgn_bits = 1,
		.exp_bits = exp,
		.mnt_bits = (uint16_t)(bits - 1 - exp),
		.sgn_mask = (vf_base_t)1 << (bits - 1),
		.exp_mask = (((vf_base_t)1 << (bits - 1)) - 1) & ~(((vf_base_t)1 << (bits - 1 - exp)) - 1),
		.mnt_mask = ((vf_base_t)1 << (bits - 1 - exp)) - 1
	};
}